

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O0

Value xmrig::Hashrate::normalize(double d)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  double in_XMM0_Qa;
  Value VVar3;
  undefined4 in_stack_ffffffffffffffd8;
  Type in_stack_ffffffffffffffdc;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this;
  
  this = in_RDI;
  bVar1 = std::isnormal(in_XMM0_Qa);
  if (bVar1) {
    floor(in_XMM0_Qa * 100.0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(this,(double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar2 = extraout_RDX_00;
  }
  else {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(this,in_stack_ffffffffffffffdc);
    uVar2 = extraout_RDX;
  }
  VVar3.data_.s.str = (Ch *)uVar2;
  VVar3.data_.n = (Number)in_RDI;
  return (Value)VVar3.data_;
}

Assistant:

rapidjson::Value xmrig::Hashrate::normalize(double d)
{
    using namespace rapidjson;

    if (!std::isnormal(d)) {
        return Value(kNullType);
    }

    return Value(floor(d * 100.0) / 100.0);
}